

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

ConstNodeRef __thiscall c4::yml::Tree::operator[](Tree *this,size_t i)

{
  pfn_error p_Var1;
  Location LVar2;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  size_t id;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ConstNodeRef CVar5;
  char msg_1 [27];
  size_t ch;
  char msg [68];
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  Location *in_stack_fffffffffffffe90;
  Location *this_00;
  Tree *t;
  size_t local_138;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  size_t in_stack_ffffffffffffff10;
  Tree *in_stack_ffffffffffffff18;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  char *local_a0;
  char local_98 [112];
  char *local_28;
  undefined1 *local_18;
  ConstNodeRef local_10;
  
  CVar5 = rootref((Tree *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  local_18 = &stack0xfffffffffffffec0;
  t = CVar5.m_tree;
  if (t == (Tree *)0x0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location((Location *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffe78 = (undefined4)local_98._96_8_;
    in_stack_fffffffffffffe7c = SUB84(local_98._96_8_,4);
    in_stack_fffffffffffffe80 = (undefined4)local_98._104_8_;
    in_stack_fffffffffffffe84 = SUB84(local_98._104_8_,4);
    in_stack_fffffffffffffe70 = (undefined4)local_98._88_8_;
    in_stack_fffffffffffffe74 = SUB84(local_98._88_8_,4);
    loc.super_LineCol.line = in_RDI;
    loc.super_LineCol.offset = in_RSI;
    loc.super_LineCol.col = in_stack_fffffffffffffee0;
    loc.name.str = (char *)in_stack_fffffffffffffee8;
    loc.name.len._0_4_ = in_stack_fffffffffffffef0;
    loc.name.len._4_4_ = in_stack_fffffffffffffef4;
    error<71ul>((char (*) [71])0x0,loc);
    in_stack_fffffffffffffe88 = local_28;
  }
  local_138 = CVar5.m_id;
  if (local_138 == 0xffffffffffffffff) {
    memcpy(local_98,"check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)",0x44);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (t->m_callbacks).m_error;
    Location::Location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    in_stack_fffffffffffffe78 = (undefined4)local_b0;
    in_stack_fffffffffffffe7c = (undefined4)((ulong)local_b0 >> 0x20);
    in_stack_fffffffffffffe80 = (undefined4)uStack_a8;
    in_stack_fffffffffffffe84 = (undefined4)((ulong)uStack_a8 >> 0x20);
    in_stack_fffffffffffffe70 = (undefined4)uStack_b8;
    in_stack_fffffffffffffe74 = (undefined4)((ulong)uStack_b8 >> 0x20);
    LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffffe70;
    LVar2.super_LineCol.offset = local_c0;
    LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffffe74;
    LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffffe78;
    LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffffe7c;
    LVar2.name.str._0_4_ = in_stack_fffffffffffffe80;
    LVar2.name.str._4_4_ = in_stack_fffffffffffffe84;
    LVar2.name.len = (size_t)local_a0;
    (*p_Var1)(local_98,0x44,LVar2,(t->m_callbacks).m_user_data);
    in_stack_fffffffffffffe88 = local_a0;
  }
  id = child(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (id == 0xffffffffffffffff) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    this_00 = (Location *)(t->m_callbacks).m_error;
    Location::Location(this_00,in_stack_fffffffffffffe88,
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    (*(code *)this_00)(&stack0xffffffffffffff18,0x1b,(t->m_callbacks).m_user_data);
  }
  ConstNodeRef::ConstNodeRef(&local_10,t,id);
  CVar5.m_id = local_10.m_id;
  CVar5.m_tree = local_10.m_tree;
  return CVar5;
}

Assistant:

ConstNodeRef Tree::operator[] (size_t i) const
{
    return rootref()[i];
}